

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::Init::normalXavier
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int n_in,int param_4)

{
  float *__first;
  float *__last;
  anon_class_16_2_74ab9900 __gen;
  normal_distribution<float> nd;
  normal_distribution<float> local_10;
  
  if (n_in < 1) {
    local_10._M_param._M_stddev = 1.0;
  }
  else {
    local_10._M_param._M_stddev = SQRT(1.0 / (float)n_in);
  }
  local_10._M_param._M_mean = 0.0;
  local_10._M_saved = 0.0;
  local_10._M_saved_available = false;
  __first = weights->_M_data;
  __last = __first + weights->_M_size;
  if (weights->_M_size == 0) {
    __last = (float *)0x0;
    __first = (float *)0x0;
  }
  __gen.rng = rng;
  __gen.nd = &local_10;
  ::std::
  generate<float*,notch::core::Init::normalXavier(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_1_>
            (__first,__last,__gen);
  return;
}

Assistant:

static
    void normalXavier(std::unique_ptr<RNG> &rng, Array &weights, int n_in, int) {
        float sigma = n_in > 0 ? sqrt(1.0 / n_in) : 1.0;
        std::normal_distribution<float> nd(0.0, sigma);
        std::generate(std::begin(weights), std::end(weights), [&nd, &rng] {
            float w = nd(*rng.get());
            return w;
        });
    }